

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_test.cpp
# Opt level: O0

void __thiscall
metacall_test_DefaultConstructor_Test::TestBody(metacall_test_DefaultConstructor_Test *this)

{
  bool bVar1;
  char *pcVar2;
  ostream *this_00;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  char *inspect_str;
  void *allocator;
  metacall_allocator_std_type std_ctx;
  size_t size;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  int result;
  void *func;
  void *ret;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  metacall_log_stdio_type log_stdio;
  char **in_stack_fffffffffffffcf0;
  AssertionResult *this_01;
  undefined7 in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  char *in_stack_fffffffffffffd00;
  char *in_stack_fffffffffffffd08;
  AssertionResult *this_02;
  AssertHelper local_228;
  Message local_220;
  undefined8 local_218;
  undefined8 local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  char *local_1e8;
  undefined8 local_1e0;
  AssertionResult local_1d8;
  char *local_1c8;
  undefined8 local_1c0;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  code *local_1a8;
  undefined8 local_1a0;
  AssertHelper local_198;
  Message local_190;
  undefined4 local_188;
  undefined4 local_184;
  AssertionResult local_180;
  AssertHelper local_170;
  Message local_168;
  undefined8 local_160;
  undefined8 local_158;
  AssertionResult local_150;
  AssertHelper local_140;
  Message local_138;
  undefined8 local_130;
  undefined8 local_128;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_100;
  undefined4 local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  AssertionResult local_c8;
  AssertHelper local_b8;
  Message local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  AssertionResult local_a0;
  undefined4 local_8c;
  undefined8 local_88;
  undefined8 local_80;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_68;
  undefined4 local_64;
  AssertionResult local_60;
  uint local_4c;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_28;
  undefined4 local_24;
  AssertionResult local_20;
  undefined8 local_10 [2];
  
  metacall_print_info();
  local_10[0] = _stdout;
  local_24 = 0;
  local_28 = metacall_log(0,local_10);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
             (int *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
             (int *)in_stack_fffffffffffffcf0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10bac7);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
               ,0x44,pcVar2);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x10bb2a);
  }
  local_4c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bb98);
  if (local_4c == 0) {
    local_64 = 0;
    local_68 = metacall_initialize();
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
               (int *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
               (int *)in_stack_fffffffffffffcf0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
    if (!bVar1) {
      testing::Message::Message(&local_70);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10bc63);
      testing::internal::AssertHelper::AssertHelper
                (&local_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                 ,0x46,pcVar2);
      testing::internal::AssertHelper::operator=(&local_78,&local_70);
      testing::internal::AssertHelper::~AssertHelper(&local_78);
      testing::Message::~Message((Message *)0x10bcc6);
    }
    local_4c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bd34);
    if (local_4c == 0) {
      local_80 = 0;
      local_88 = 0;
      local_8c = 0;
      local_a4 = 0;
      local_a8 = metacall_register("c_print",c_function,0,3,1,7);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                 (int *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                 (int *)in_stack_fffffffffffffcf0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
      if (!bVar1) {
        testing::Message::Message(&local_b0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10be45);
        testing::internal::AssertHelper::AssertHelper
                  (&local_b8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                   ,0x6b,pcVar2);
        testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
        testing::internal::AssertHelper::~AssertHelper(&local_b8);
        testing::Message::~Message((Message *)0x10bea8);
      }
      local_4c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10bf16);
      if (local_4c == 0) {
        local_d8 = metacall("c_print","Hello native function!");
        local_d0 = 0;
        local_80 = local_d8;
        testing::internal::CmpHelperNE<void*,void*>
                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   (void **)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
        if (!bVar1) {
          testing::Message::Message(&local_e0);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c003);
          testing::internal::AssertHelper::AssertHelper
                    (&local_e8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x6f,pcVar2);
          testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
          testing::internal::AssertHelper::~AssertHelper(&local_e8);
          testing::Message::~Message((Message *)0x10c066);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c0be);
        local_fc = metacall_value_to_int(local_80);
        local_100 = 1;
        local_8c = local_fc;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   (int *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   (int *)in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
        if (!bVar1) {
          testing::Message::Message(&local_108);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c18d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_110,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x73,pcVar2);
          testing::internal::AssertHelper::operator=(&local_110,&local_108);
          testing::internal::AssertHelper::~AssertHelper(&local_110);
          testing::Message::~Message((Message *)0x10c1ea);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c242);
        metacall_value_destroy(local_80);
        local_130 = metacall_function("c_print");
        local_128 = 0;
        local_88 = local_130;
        testing::internal::CmpHelperNE<void*,void*>
                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   (void **)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_120);
        if (!bVar1) {
          testing::Message::Message(&local_138);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c315);
          testing::internal::AssertHelper::AssertHelper
                    (&local_140,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x79,pcVar2);
          testing::internal::AssertHelper::operator=(&local_140,&local_138);
          testing::internal::AssertHelper::~AssertHelper(&local_140);
          testing::Message::~Message((Message *)0x10c372);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c3ca);
        local_160 = metacallf(local_88,"Hello native function!");
        local_158 = 0;
        local_80 = local_160;
        testing::internal::CmpHelperNE<void*,void*>
                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   (void **)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_150);
        if (!bVar1) {
          testing::Message::Message(&local_168);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c49a);
          testing::internal::AssertHelper::AssertHelper
                    (&local_170,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x7d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_170,&local_168);
          testing::internal::AssertHelper::~AssertHelper(&local_170);
          testing::Message::~Message((Message *)0x10c4f7);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c54f);
        local_184 = metacall_value_to_int(local_80);
        local_188 = 1;
        local_8c = local_184;
        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                  (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                   (int *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   (int *)in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_180);
        if (!bVar1) {
          testing::Message::Message(&local_190);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c612);
          testing::internal::AssertHelper::AssertHelper
                    (&local_198,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x81,pcVar2);
          testing::internal::AssertHelper::operator=(&local_198,&local_190);
          testing::internal::AssertHelper::~AssertHelper(&local_198);
          testing::Message::~Message((Message *)0x10c66f);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c6c7);
        metacall_value_destroy(local_80);
        local_1a0 = 0;
        local_1a8 = free;
        local_1b8 = 0x188550;
        uStack_1b4 = 0;
        uStack_1b0 = 0x1886b8;
        uStack_1ac = 0;
        local_1c0 = metacall_allocator_create(0,&local_1b8);
        local_1e8 = (char *)metacall_inspect(&local_1a0,local_1c0);
        local_1e0 = 0;
        this_02 = &local_1d8;
        local_1c8 = local_1e8;
        testing::internal::CmpHelperNE<char*,char*>
                  (&this_02->success_,in_stack_fffffffffffffd00,
                   (char **)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   in_stack_fffffffffffffcf0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
        if (!bVar1) {
          testing::Message::Message(&local_1f0);
          in_stack_fffffffffffffd00 =
               testing::AssertionResult::failure_message((AssertionResult *)0x10c7e4);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,0x255,in_stack_fffffffffffffd00);
          testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
          testing::internal::AssertHelper::~AssertHelper(&local_1f8);
          testing::Message::~Message((Message *)0x10c841);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c896);
        local_210 = local_1a0;
        local_218 = 0;
        this_01 = &local_208;
        testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
                  (&this_02->success_,in_stack_fffffffffffffd00,
                   (unsigned_long *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                   (unsigned_long *)this_01);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(this_01);
        if (!bVar1) {
          testing::Message::Message(&local_220);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x10c948);
          testing::internal::AssertHelper::AssertHelper
                    (&local_228,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/metacall_test/source/metacall_test.cpp"
                     ,599,pcVar2);
          testing::internal::AssertHelper::operator=(&local_228,&local_220);
          testing::internal::AssertHelper::~AssertHelper(&local_228);
          testing::Message::~Message((Message *)0x10c9a3);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10c9f8);
        this_00 = std::operator<<((ostream *)&std::cout,local_1c8);
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        metacall_allocator_free(local_1c0,local_1c8);
        metacall_allocator_destroy(local_1c0);
        metacall_destroy();
      }
    }
  }
  return;
}

Assistant:

TEST_F(metacall_test, DefaultConstructor)
{
	metacall_print_info();

	metacall_log_stdio_type log_stdio = { stdout };

	ASSERT_EQ((int)0, (int)metacall_log(METACALL_LOG_STDIO, (void *)&log_stdio));

	ASSERT_EQ((int)0, (int)metacall_initialize());

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
	#if defined(WIN32) || defined(_WIN32)

		DWORD length = MAX_PATH;
		char cwd[MAX_PATH];

		ASSERT_NE((DWORD)0, (DWORD)GetCurrentDirectory(length, cwd));

	#elif defined(unix) || defined(__unix__) || defined(__unix) || \
		defined(linux) || defined(__linux__) || defined(__linux) || defined(__gnu_linux) || \
		defined(__CYGWIN__) || defined(__CYGWIN32__) || \
		defined(__MINGW32__) || defined(__MINGW64__) || \
		(defined(__APPLE__) && defined(__MACH__)) || defined(__MACOSX__)

		char cwd[PATH_MAX];

		ASSERT_NE((char *)NULL, (char *)getcwd(cwd, sizeof(cwd)));

	#endif

		/* Lazy evaluation of execution paths (do not initialize Python runtime) */
		ASSERT_EQ((int)0, (int)metacall_execution_path("py", cwd));
	}
#endif /* OPTION_BUILD_LOADERS_PY */

	/* Native register */
	{
		void *ret = NULL;

		void *func = NULL;

		int result = 0;

		ASSERT_EQ((int)0, (int)metacall_register("c_print", c_function, NULL, METACALL_INT, 1, METACALL_STRING));

		ret = metacall("c_print", "Hello native function!");

		EXPECT_NE((void *)NULL, (void *)ret);

		result = metacall_value_to_int(ret);

		EXPECT_EQ((int)result, (int)1);

		metacall_value_destroy(ret);

		func = metacall_function("c_print");

		EXPECT_NE((void *)NULL, (void *)func);

		ret = metacallf(func, "Hello native function!");

		EXPECT_NE((void *)NULL, (void *)ret);

		result = metacall_value_to_int(ret);

		EXPECT_EQ((int)result, (int)1);

		metacall_value_destroy(ret);
	}

/* Python */
#if defined(OPTION_BUILD_LOADERS_PY)
	{
		const char *py_scripts[] = {
			"example.py", "web.py"
		};

		const char web_content[] =
			"<html>\n"
			"  <head>\n"
			"    <title>MetaCall Python Web</title>\n"
			"  </head>\n"
			"  <body>\n"
			"    Hello World\n"
			"  </body>\n"
			"</html>\n";

		const long seven_multiples_limit = 10;

		long iterator;

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("py", py_scripts, sizeof(py_scripts) / sizeof(py_scripts[0]), NULL));

		/* Test for asyncness Python introspection */
		EXPECT_EQ((int)0, metacall_function_async(metacall_function("multiply")));

		ret = metacall("multiply", 5, 15);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)75);

		metacall_value_destroy(ret);

		for (iterator = 0; iterator <= seven_multiples_limit; ++iterator)
		{
			ret = metacall("multiply", 7, iterator);

			EXPECT_NE((void *)NULL, (void *)ret);

			EXPECT_EQ((long)metacall_value_to_long(ret), (long)(7 * iterator));

			metacall_value_destroy(ret);
		}

		ret = metacall("divide", 64.0, 2.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)32.0);

		metacall_value_destroy(ret);

		ret = metacall("sum", 1000, 3500);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)4500);

		metacall_value_destroy(ret);

		ret = metacall("sum", 3, 4);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((long)metacall_value_to_long(ret), (long)7);

		metacall_value_destroy(ret);

		ret = metacall("hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		EXPECT_EQ((void *)NULL, (void *)metacall_value_to_null(ret));

		metacall_value_destroy(ret);

		ret = metacall("strcat", "Hello ", "Universe");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello Universe"));

		metacall_value_destroy(ret);

		/* Testing Python Buffer */
		char buffer[] = { 0, 1, 2, 3, 4 };

		void *buffer_value = metacall_value_create_buffer((void *)buffer, sizeof(buffer));

		void *args[] = {
			buffer_value
		};

		EXPECT_NE((void *)NULL, (void *)buffer_value);

		ret = metacallv("bytebuff", args);

		metacall_value_destroy(buffer_value);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((size_t)sizeof("abcd") - 1, (size_t)metacall_value_size(ret));

		EXPECT_EQ((int)0, (int)memcmp(metacall_value_to_buffer(ret), "abcd", metacall_value_size(ret)));

		metacall_value_destroy(ret);

		const size_t dyn_buffer_size = 256;

		unsigned char *dyn_buffer = (unsigned char *)malloc(sizeof(unsigned char) * dyn_buffer_size);

		for (size_t i = 0; i < dyn_buffer_size; ++i)
		{
			dyn_buffer[i] = (unsigned char)i;
		}

		buffer_value = metacall_value_create_buffer((void *)dyn_buffer, dyn_buffer_size);

		EXPECT_NE((void *)NULL, (void *)buffer_value);

		args[0] = buffer_value;

		ret = metacallv("bytebuff", args);

		metacall_value_destroy(buffer_value);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((size_t)sizeof("abcd") - 1, (size_t)metacall_value_size(ret));

		EXPECT_EQ((int)0, (int)memcmp(metacall_value_to_buffer(ret), "abcd", metacall_value_size(ret)));

		metacall_value_destroy(ret);

		free(dyn_buffer);

		ret = metacall("index");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), web_content));

		metacall_value_destroy(ret);

	#if !defined(__MEMORYCHECK__) && !defined(__ADDRESS_SANITIZER__) && !defined(__THREAD_SANITIZER__) && !defined(__MEMORY_SANITIZER__)
		/* Testing corrupted value input */
		struct
		{
			int a;
			int corrupted;
			int value;
			char padding[100];
		} corrupted_value = { 0, 0, 0, { 0 } };

		void *corrupted_args[] = {
			(void *)&corrupted_value,
			(void *)&corrupted_value
		};

		EXPECT_EQ((void *)NULL, (void *)metacallfv_s(metacall_function("multiply"), corrupted_args, 2));

			/* Testing freed value input */

			/* TODO: The next snippet of code works but address sanitizer warns about access warning,
		* because in order to check the magic number we need to access the pointer to the struct.
		* A better solution would be, when using a custom memory pool allocator (aka object pool)
		* detect if the pointer is allocated or not in the object pool, so we track it without
		* need to access the pointer in order to read it. This can be a better improvement but
		* for now, this would be sufficient to catch most of the errors.
		*/

			/*
		void *freed_args[] = {
			(void *)metacall_value_create_long(3L),
			(void *)metacall_value_create_long(5L)
		};

		metacall_value_destroy(freed_args[0]);
		metacall_value_destroy(freed_args[1]);

		EXPECT_EQ((void *)NULL, (void *)metacallfv_s(metacall_function("multiply"), freed_args, 2));
		*/
	#endif
	}
#endif /* OPTION_BUILD_LOADERS_PY */

/* Ruby */
#if defined(OPTION_BUILD_LOADERS_RB)
	{
		const char *rb_scripts[] = {
			"hello.rb", "second.rb"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("rb", rb_scripts, sizeof(rb_scripts) / sizeof(rb_scripts[0]), NULL));

		ret = metacall("say_multiply", 5, 7);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)35);

		metacall_value_destroy(ret);

		ret = metacall("say_null");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((enum metacall_value_id)METACALL_NULL, (enum metacall_value_id)metacall_value_id(ret));

		metacall_value_destroy(ret);

		ret = metacall("say_hello", "meta-programmer");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello meta-programmer!"));

		metacall_value_destroy(ret);

		ret = metacall("get_second", 5, 12);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)12);

		metacall_value_destroy(ret);

		const enum metacall_value_id backwards_prime_int_ids[] = {
			METACALL_INT, METACALL_INT
		};

		ret = metacallt("backwardsPrime", backwards_prime_int_ids, 9900, 10000);

		EXPECT_NE((void *)NULL, (void *)ret);

		void **v_array = metacall_value_to_array(ret);

		EXPECT_EQ((int)metacall_value_to_int(v_array[0]), (int)9923);
		EXPECT_EQ((int)metacall_value_to_int(v_array[1]), (int)9931);
		EXPECT_EQ((int)metacall_value_to_int(v_array[2]), (int)9941);
		EXPECT_EQ((int)metacall_value_to_int(v_array[3]), (int)9967);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_RB */

/* JavaScript SpiderMonkey */
#if defined(OPTION_BUILD_LOADERS_JSM)
	{
		const char *jsm_scripts[] = {
			"spider.jsm"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("jsm", jsm_scripts, sizeof(jsm_scripts) / sizeof(jsm_scripts[0]), NULL));

		EXPECT_EQ((void *)NULL, (void *)metacall("say_spider", 8, 4));
	}
#endif /* OPTION_BUILD_LOADERS_JSM */

/* JavaScript V8 */
#if defined(OPTION_BUILD_LOADERS_JS) && !defined(OPTION_BUILD_LOADERS_NODE) /* TODO: NodeJS and V8 runtimes do not work at same time */
	{
		const char *js_scripts[] = {
			"divide.js", "third.js"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("js", js_scripts, sizeof(js_scripts) / sizeof(js_scripts[0]), NULL));

		ret = metacall("say_divide", 32.0, 4.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)8.0);

		metacall_value_destroy(ret);

		ret = metacall("some_text", "abc", "def");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "abcdef"));

		metacall_value_destroy(ret);

		ret = metacall("third_value", "abc", "def", "efg");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "efg"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_JS */

/* Mock */
#if defined(OPTION_BUILD_LOADERS_MOCK)
	{
		const char *mock_scripts[] = {
			"empty.mock"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("mock", mock_scripts, sizeof(mock_scripts) / sizeof(mock_scripts[0]), NULL));

		ret = metacall("my_empty_func");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)metacall_value_to_int(ret), (int)1234);

		metacall_value_destroy(ret);

		ret = metacall("two_doubles", 3.14, 68.3);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)3.1416);

		metacall_value_destroy(ret);

		ret = metacall("mixed_args", 'E', 16, 34L, 4.6, "hello");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((char)metacall_value_to_char(ret), (char)'A');

		metacall_value_destroy(ret);

		ret = metacall("new_args", "goodbye");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((int)0, (int)strcmp(metacall_value_to_string(ret), "Hello World"));

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_MOCK */

/* C# NetCore */
#if defined(OPTION_BUILD_LOADERS_CS)
	{
		const char *cs_scripts[] = {
			"hello.cs"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("cs", cs_scripts, sizeof(cs_scripts) / sizeof(cs_scripts[0]), NULL));

		EXPECT_EQ((void *)NULL, (void *)metacall("Say", "Hello para with params!"));
	}
#endif /* OPTION_BUILD_LOADERS_CS */

/* C */
#if defined(OPTION_BUILD_LOADERS_C)
	{
		const char *c_scripts[] = {
			"compiled.c"
		};

		EXPECT_EQ((int)0, (int)metacall_load_from_file("c", c_scripts, sizeof(c_scripts) / sizeof(c_scripts[0]), NULL));
	}
#endif /* OPTION_BUILD_LOADERS_C */

/* NodeJS */
#if defined(OPTION_BUILD_LOADERS_NODE)
	{
		const char *node_scripts[] = {
			"nod.js"
		};

		const enum metacall_value_id hello_boy_double_ids[] = {
			METACALL_DOUBLE, METACALL_DOUBLE
		};

		const char buffer[] =
			"function nodmem() {\n"
			"\treturn 43;\n"
			"\t}\n"
			"module.exports = { nodmem };\n";

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("node", node_scripts, sizeof(node_scripts) / sizeof(node_scripts[0]), NULL));

		ret = metacallt("hello_boy", hello_boy_double_ids, 3.0, 4.0);

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)7.0);

		metacall_value_destroy(ret);

		ret = metacall("lambda");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)15.0);

		metacall_value_destroy(ret);

		/* TODO: Implement all remaining calls for nod.js */

		ASSERT_EQ((int)0, (int)metacall_load_from_memory("node", buffer, sizeof(buffer), NULL));

		ret = metacall("nodmem");

		EXPECT_NE((void *)NULL, (void *)ret);

		EXPECT_EQ((double)metacall_value_to_double(ret), (double)43.0);

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_NODE */

/* File */
#if defined(OPTION_BUILD_LOADERS_FILE)
	{
		const char *file_scripts[] = {
			"static.html",
			"favicon.ico"
		};

		void *ret = NULL;

		EXPECT_EQ((int)0, (int)metacall_load_from_file("file", file_scripts, sizeof(file_scripts) / sizeof(file_scripts[0]), NULL));

		ret = metacall("static.html");

		EXPECT_NE((void *)NULL, (void *)ret);

		std::cout << metacall_value_to_string(ret) << std::endl;

		metacall_value_destroy(ret);

		ret = metacall("favicon.ico");

		EXPECT_NE((void *)NULL, (void *)ret);

		std::cout << metacall_value_to_string(ret) << std::endl;

		metacall_value_destroy(ret);
	}
#endif /* OPTION_BUILD_LOADERS_FILE */

	/* Print inspect information */
	{
		size_t size = 0;

		struct metacall_allocator_std_type std_ctx = { &std::malloc, &std::realloc, &std::free };

		void *allocator = metacall_allocator_create(METACALL_ALLOCATOR_STD, (void *)&std_ctx);

		char *inspect_str = metacall_inspect(&size, allocator);

		EXPECT_NE((char *)NULL, (char *)inspect_str);

		EXPECT_GT((size_t)size, (size_t)0);

		std::cout << inspect_str << std::endl;

		metacall_allocator_free(allocator, inspect_str);

		metacall_allocator_destroy(allocator);
	}

	metacall_destroy();
}